

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxgeometsc.hpp
# Opt level: O3

void __thiscall
soplex::
SPxGeometSC<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::scale(SPxGeometSC<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        *this,SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *lp,bool persistent)

{
  bool bVar1;
  uint uVar2;
  fpclass_type fVar3;
  int32_t iVar4;
  Tolerances *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  char cVar5;
  int iVar6;
  int iVar7;
  uint *puVar8;
  bool *pbVar9;
  long lVar10;
  fpclass_type *pfVar11;
  char *pcVar12;
  cpp_dec_float<200U,_int,_void> *pcVar13;
  cpp_dec_float<200u,int,void> *pcVar14;
  cpp_dec_float<200U,_int,_void> *pcVar15;
  cpp_dec_float<200U,_int,_void> *pcVar16;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar17;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar18;
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  *pvVar19;
  SPxOut *pSVar20;
  Item *this_02;
  DataArray<int> *vecExp;
  DataArray<int> *vecExp_00;
  bool bVar21;
  byte bVar22;
  Real a;
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  rowscale;
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  colscale;
  Verbosity old_verbosity_4;
  Verbosity old_verbosity_1;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  epsilon;
  Verbosity old_verbosity_5;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  rowratio;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  colratio;
  uint local_fb4;
  undefined1 local_fa8 [16];
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_f98;
  undefined1 local_f90 [16];
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_f80;
  cpp_dec_float<200U,_int,_void> *local_f78;
  Item *local_f70;
  undefined1 local_f68 [32];
  undefined1 local_f48 [16];
  undefined1 local_f38 [16];
  undefined1 local_f28 [16];
  undefined1 local_f18 [16];
  undefined1 local_f08 [13];
  undefined3 uStack_efb;
  uint uStack_ef8;
  bool bStack_ef4;
  ulong local_ef0;
  uint *local_ee0;
  uint *local_ed8;
  SPxGeometSC<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_ed0;
  undefined1 local_ec8 [32];
  undefined1 local_ea8 [16];
  undefined1 local_e98 [16];
  undefined1 local_e88 [16];
  undefined1 local_e78 [16];
  undefined1 local_e68 [13];
  undefined3 uStack_e5b;
  uint uStack_e58;
  bool abStack_e54 [4];
  ulong local_e50;
  undefined1 local_e48 [32];
  undefined1 local_e28 [16];
  undefined1 local_e18 [16];
  undefined1 local_e08 [16];
  undefined1 local_df8 [16];
  undefined1 local_de8 [13];
  undefined3 uStack_ddb;
  uint uStack_dd8;
  bool abStack_dd4 [4];
  ulong local_dd0;
  undefined1 local_dc8 [16];
  undefined1 local_db8 [32];
  undefined1 local_d98 [16];
  undefined1 local_d88 [16];
  undefined1 local_d78 [16];
  undefined1 local_d68 [16];
  undefined1 local_d58 [13];
  undefined3 uStack_d4b;
  int iStack_d48;
  bool bStack_d44;
  undefined8 local_d40;
  cpp_dec_float<200u,int,void> local_d38 [16];
  undefined1 local_d28 [16];
  undefined1 local_d18 [16];
  undefined1 local_d08 [16];
  undefined1 local_cf8 [16];
  undefined1 local_ce8 [16];
  undefined1 local_cd8 [13];
  undefined3 uStack_ccb;
  int iStack_cc8;
  undefined1 uStack_cc4;
  undefined8 local_cc0;
  cpp_dec_float<200U,_int,_void> local_cb8;
  cpp_dec_float<200U,_int,_void> local_c38;
  cpp_dec_float<200U,_int,_void> local_bb8;
  cpp_dec_float<200U,_int,_void> local_b38;
  undefined1 local_ab8 [32];
  undefined1 local_a98 [16];
  undefined1 local_a88 [16];
  undefined1 local_a78 [16];
  undefined1 local_a68 [16];
  undefined1 local_a58 [16];
  uint local_a48;
  bool local_a44;
  fpclass_type local_a40;
  int32_t iStack_a3c;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_a38;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_9b8;
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  local_938 [4];
  int local_8c8;
  undefined1 local_8c4;
  fpclass_type local_8c0;
  int32_t iStack_8bc;
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  local_8b8 [4];
  int local_848;
  undefined1 local_844;
  fpclass_type local_840;
  int32_t iStack_83c;
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  local_838 [4];
  int local_7c8;
  undefined1 local_7c4;
  fpclass_type local_7c0;
  int32_t iStack_7bc;
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  local_7b8 [4];
  int local_748;
  undefined1 local_744;
  fpclass_type local_740;
  int32_t iStack_73c;
  undefined1 local_738 [32];
  undefined1 local_718 [16];
  undefined1 local_708 [16];
  undefined1 local_6f8 [16];
  undefined1 local_6e8 [16];
  undefined1 local_6d8 [16];
  uint local_6c8;
  bool local_6c4;
  fpclass_type local_6c0;
  int32_t iStack_6bc;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_6b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_630;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_5b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_530;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_4b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_430;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_3b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_330;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_230;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_130;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_b0;
  
  bVar22 = 0;
  pSVar20 = (this->
            super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).spxout;
  if ((pSVar20 != (SPxOut *)0x0) && (2 < (int)pSVar20->m_verbosity)) {
    local_bb8.data._M_elems[0] = 3;
    local_b38.data._M_elems[0] = pSVar20->m_verbosity;
    (*pSVar20->_vptr_SPxOut[2])();
    pSVar20 = (this->
              super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).spxout;
    std::__ostream_insert<char,std::char_traits<char>>
              (pSVar20->m_streams[pSVar20->m_verbosity],"Geometric scaling LP",0x14);
    pcVar12 = " (persistent)";
    if (!persistent) {
      pcVar12 = "";
    }
    lVar10 = 0xd;
    if (!persistent) {
      lVar10 = 0;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (pSVar20->m_streams[pSVar20->m_verbosity],pcVar12,lVar10);
    pcVar12 = " with post-equilibration";
    bVar21 = this->postequilibration == false;
    if (bVar21) {
      pcVar12 = "";
    }
    lVar10 = 0x18;
    if (bVar21) {
      lVar10 = 0;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (pSVar20->m_streams[pSVar20->m_verbosity],pcVar12,lVar10);
    cVar5 = (char)pSVar20->m_streams[pSVar20->m_verbosity];
    std::ios::widen((char)*(undefined8 *)(*(long *)pSVar20->m_streams[pSVar20->m_verbosity] + -0x18)
                    + cVar5);
    std::ostream::put(cVar5);
    std::ostream::flush();
    pSVar20 = (this->
              super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).spxout;
    (*pSVar20->_vptr_SPxOut[2])(pSVar20,&local_b38);
  }
  (**(this->
     super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
     )._vptr_SPxScaler)(this,lp);
  (*(this->
    super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    )._vptr_SPxScaler[0x33])(&local_b38,this,lp);
  (*(this->
    super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    )._vptr_SPxScaler[0x34])(&local_bb8,this,lp);
  this_00 = (this->
            super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this_01 = (this->
            super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_01->_M_use_count = this_01->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_01->_M_use_count = this_01->_M_use_count + 1;
    }
  }
  a = Tolerances::epsilon(this_00);
  local_cc0._0_4_ = cpp_dec_float_finite;
  local_cc0._4_4_ = 0x1c;
  local_d38[0] = (cpp_dec_float<200u,int,void>)0x0;
  local_d38[1] = (cpp_dec_float<200u,int,void>)0x0;
  local_d38[2] = (cpp_dec_float<200u,int,void>)0x0;
  local_d38[3] = (cpp_dec_float<200u,int,void>)0x0;
  local_d38[4] = (cpp_dec_float<200u,int,void>)0x0;
  local_d38[5] = (cpp_dec_float<200u,int,void>)0x0;
  local_d38[6] = (cpp_dec_float<200u,int,void>)0x0;
  local_d38[7] = (cpp_dec_float<200u,int,void>)0x0;
  local_d38[8] = (cpp_dec_float<200u,int,void>)0x0;
  local_d38[9] = (cpp_dec_float<200u,int,void>)0x0;
  local_d38[10] = (cpp_dec_float<200u,int,void>)0x0;
  local_d38[0xb] = (cpp_dec_float<200u,int,void>)0x0;
  local_d38[0xc] = (cpp_dec_float<200u,int,void>)0x0;
  local_d38[0xd] = (cpp_dec_float<200u,int,void>)0x0;
  local_d38[0xe] = (cpp_dec_float<200u,int,void>)0x0;
  local_d38[0xf] = (cpp_dec_float<200u,int,void>)0x0;
  local_d28 = (undefined1  [16])0x0;
  local_d18 = (undefined1  [16])0x0;
  local_d08 = (undefined1  [16])0x0;
  local_cf8 = (undefined1  [16])0x0;
  local_ce8 = (undefined1  [16])0x0;
  local_cd8 = SUB1613((undefined1  [16])0x0,0);
  uStack_ccb = 0;
  iStack_cc8 = 0;
  uStack_cc4 = 0;
  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=(local_d38,a);
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
  }
  local_fb4 = 0;
  if ((local_b38.fpclass != cpp_dec_float_NaN) && (local_bb8.fpclass != cpp_dec_float_NaN)) {
    local_fb4 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                          (&local_b38,&local_bb8);
    local_fb4 = local_fb4 >> 0x1f;
  }
  local_6d8 = (undefined1  [16])0x0;
  local_6e8 = (undefined1  [16])0x0;
  local_6f8 = (undefined1  [16])0x0;
  local_708 = (undefined1  [16])0x0;
  local_718 = (undefined1  [16])0x0;
  local_738._16_16_ = (undefined1  [16])0x0;
  local_738._0_16_ = (undefined1  [16])0x0;
  local_a58 = (undefined1  [16])0x0;
  local_a68 = (undefined1  [16])0x0;
  local_a78 = (undefined1  [16])0x0;
  local_a88 = (undefined1  [16])0x0;
  local_a98 = (undefined1  [16])0x0;
  local_ab8._16_16_ = (undefined1  [16])0x0;
  bVar21 = (char)local_fb4 != '\0';
  pcVar16 = &local_bb8;
  if (bVar21) {
    pcVar16 = &local_b38;
  }
  local_ab8._0_16_ = (undefined1  [16])0x0;
  pcVar15 = &local_b38;
  if (bVar21) {
    pcVar15 = &local_bb8;
  }
  pcVar13 = pcVar16;
  puVar8 = (uint *)local_738;
  for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
    *puVar8 = (pcVar13->data)._M_elems[0];
    pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + ((ulong)bVar22 * -2 + 1) * 4);
    puVar8 = puVar8 + (ulong)bVar22 * -2 + 1;
  }
  uVar2 = pcVar16->exp;
  pnVar18 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
             *)(ulong)uVar2;
  bVar1 = pcVar16->neg;
  pfVar11 = &local_bb8.fpclass;
  if (bVar21) {
    pfVar11 = &local_b38.fpclass;
  }
  fVar3 = *pfVar11;
  iVar4 = pcVar16->prec_elem;
  pcVar16 = pcVar15;
  puVar8 = (uint *)local_ab8;
  for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
    *puVar8 = (pcVar16->data)._M_elems[0];
    pcVar16 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar16 + ((ulong)bVar22 * -2 + 1) * 4);
    puVar8 = puVar8 + (ulong)bVar22 * -2 + 1;
  }
  local_a48 = pcVar15->exp;
  local_a44 = pcVar15->neg;
  pfVar11 = &local_b38.fpclass;
  if (bVar21) {
    pfVar11 = &local_bb8.fpclass;
  }
  local_a40 = *pfVar11;
  iStack_a3c = pcVar15->prec_elem;
  pSVar20 = (this->
            super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).spxout;
  local_6c8 = uVar2;
  local_6c4 = bVar1;
  local_6c0 = fVar3;
  iStack_6bc = iVar4;
  if ((pSVar20 != (SPxOut *)0x0) && (3 < (int)pSVar20->m_verbosity)) {
    local_ec8._0_4_ = pSVar20->m_verbosity;
    local_e48._0_4_ = 4;
    (*pSVar20->_vptr_SPxOut[2])();
    pSVar20 = (this->
              super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).spxout;
    std::__ostream_insert<char,std::char_traits<char>>
              (pSVar20->m_streams[pSVar20->m_verbosity],"before scaling:",0xf);
    std::__ostream_insert<char,std::char_traits<char>>
              (pSVar20->m_streams[pSVar20->m_verbosity]," min= ",6);
    (*(lp->
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._vptr_ClassArray[3])(&local_b0,lp,1);
    boost::multiprecision::operator<<(pSVar20->m_streams[pSVar20->m_verbosity],&local_b0);
    std::__ostream_insert<char,std::char_traits<char>>
              (pSVar20->m_streams[pSVar20->m_verbosity]," max= ",6);
    (*(lp->
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._vptr_ClassArray[4])(&local_130,lp,1);
    boost::multiprecision::operator<<(pSVar20->m_streams[pSVar20->m_verbosity],&local_130);
    std::__ostream_insert<char,std::char_traits<char>>
              (pSVar20->m_streams[pSVar20->m_verbosity]," col-ratio= ",0xc);
    pcVar16 = &local_b38;
    pnVar17 = &local_1b0;
    for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
      (pnVar17->m_backend).data._M_elems[0] = (pcVar16->data)._M_elems[0];
      pcVar16 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar16 + ((ulong)bVar22 * -2 + 1) * 4);
      pnVar17 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar17 + ((ulong)bVar22 * -2 + 1) * 4);
    }
    local_1b0.m_backend.exp = local_b38.exp;
    local_1b0.m_backend.neg = local_b38.neg;
    boost::multiprecision::operator<<(pSVar20->m_streams[pSVar20->m_verbosity],&local_1b0);
    std::__ostream_insert<char,std::char_traits<char>>
              (pSVar20->m_streams[pSVar20->m_verbosity]," row-ratio= ",0xc);
    pcVar16 = &local_bb8;
    pnVar17 = &local_230;
    for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
      (pnVar17->m_backend).data._M_elems[0] = (pcVar16->data)._M_elems[0];
      pcVar16 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar16 + ((ulong)bVar22 * -2 + 1) * 4);
      pnVar17 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar17 + ((ulong)bVar22 * -2 + 1) * 4);
    }
    local_230.m_backend.exp = local_bb8.exp;
    local_230.m_backend.neg = local_bb8.neg;
    boost::multiprecision::operator<<(pSVar20->m_streams[pSVar20->m_verbosity],&local_230);
    cVar5 = (char)pSVar20->m_streams[pSVar20->m_verbosity];
    std::ios::widen((char)*(undefined8 *)(*(long *)pSVar20->m_streams[pSVar20->m_verbosity] + -0x18)
                    + cVar5);
    std::ostream::put(cVar5);
    std::ostream::flush();
    pSVar20 = (this->
              super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).spxout;
    (*pSVar20->_vptr_SPxOut[2])(pSVar20,local_ec8);
  }
  if ((local_a40 == cpp_dec_float_NaN) ||
     ((this->m_goodEnoughRatio).m_backend.fpclass == cpp_dec_float_NaN)) {
LAB_0058d1eb:
    pSVar20 = (this->
              super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).spxout;
    if ((pSVar20 != (SPxOut *)0x0) && (3 < (int)pSVar20->m_verbosity)) {
      local_ec8._0_4_ = pSVar20->m_verbosity;
      local_e48._0_4_ = 4;
      (*pSVar20->_vptr_SPxOut[2])();
      pSVar20 = (this->
                super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).spxout;
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar20->m_streams[pSVar20->m_verbosity],
                 "No geometric scaling done, ratio good enough",0x2c);
      cVar5 = (char)pSVar20->m_streams[pSVar20->m_verbosity];
      std::ios::widen((char)*(undefined8 *)
                             (*(long *)pSVar20->m_streams[pSVar20->m_verbosity] + -0x18) + cVar5);
      std::ostream::put(cVar5);
      std::ostream::flush();
      pSVar20 = (this->
                super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).spxout;
      (*pSVar20->_vptr_SPxOut[2])(pSVar20,local_ec8);
    }
    if (this->postequilibration == false) {
      lp->_isScaled = true;
      return;
    }
    pSVar20 = (this->
              super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).spxout;
    if ((pSVar20 != (SPxOut *)0x0) && (3 < (int)pSVar20->m_verbosity)) {
      local_ec8._0_4_ = pSVar20->m_verbosity;
      local_e48._0_4_ = 4;
      (*pSVar20->_vptr_SPxOut[2])();
      pSVar20 = (this->
                super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).spxout;
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar20->m_streams[pSVar20->m_verbosity],
                 " ... but will still perform equilibrium scaling",0x2f);
      cVar5 = (char)pSVar20->m_streams[pSVar20->m_verbosity];
      std::ios::widen((char)*(undefined8 *)
                             (*(long *)pSVar20->m_streams[pSVar20->m_verbosity] + -0x18) + cVar5);
      std::ostream::put(cVar5);
      std::ostream::flush();
      pSVar20 = (this->
                super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).spxout;
      (*pSVar20->_vptr_SPxOut[2])(pSVar20,local_ec8);
    }
    bVar21 = false;
  }
  else {
    iVar6 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                      ((cpp_dec_float<200U,_int,_void> *)local_ab8,
                       &(this->m_goodEnoughRatio).m_backend);
    bVar21 = true;
    if (iVar6 < 1) goto LAB_0058d1eb;
  }
  uVar2 = (lp->
          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thenum;
  local_e50._0_4_ = cpp_dec_float_finite;
  local_e50._4_4_ = 0x1c;
  local_ec8._0_16_ = (undefined1  [16])0x0;
  local_ec8._16_16_ = (undefined1  [16])0x0;
  local_ea8 = (undefined1  [16])0x0;
  local_e98 = (undefined1  [16])0x0;
  local_e88 = (undefined1  [16])0x0;
  local_e78 = (undefined1  [16])0x0;
  local_e68 = SUB1613((undefined1  [16])0x0,0);
  uStack_e5b = 0;
  uStack_e58 = 0;
  abStack_e54[0] = false;
  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
            ((cpp_dec_float<200u,int,void> *)local_ec8,1.0);
  std::
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  ::vector((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            *)local_fa8,(ulong)uVar2,(value_type *)local_ec8,(allocator_type *)local_e48);
  uVar2 = (lp->
          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thenum;
  local_e50._0_4_ = cpp_dec_float_finite;
  local_e50._4_4_ = 0x1c;
  local_ec8._0_16_ = (undefined1  [16])0x0;
  local_ec8._16_16_ = (undefined1  [16])0x0;
  local_ea8 = (undefined1  [16])0x0;
  local_e98 = (undefined1  [16])0x0;
  local_e88 = (undefined1  [16])0x0;
  local_e78 = (undefined1  [16])0x0;
  local_e68 = SUB1613((undefined1  [16])0x0,0);
  uStack_e5b = 0;
  uStack_e58 = 0;
  abStack_e54[0] = false;
  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
            ((cpp_dec_float<200u,int,void> *)local_ec8,1.0);
  std::
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  ::vector((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            *)local_f90,(ulong)uVar2,(value_type *)local_ec8,(allocator_type *)local_e48);
  local_e50 = 0x1c00000000;
  local_ec8._0_16_ = (undefined1  [16])0x0;
  local_ec8._16_16_ = (undefined1  [16])0x0;
  local_ea8 = (undefined1  [16])0x0;
  local_e98 = (undefined1  [16])0x0;
  local_e88 = (undefined1  [16])0x0;
  local_e78 = (undefined1  [16])0x0;
  local_e68 = SUB1613((undefined1  [16])0x0,0);
  uStack_e5b = 0;
  uStack_e58 = 0;
  abStack_e54[0] = false;
  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
            ((cpp_dec_float<200u,int,void> *)local_ec8,0.0);
  local_dd0 = 0x1c00000000;
  local_e48._0_16_ = (undefined1  [16])0x0;
  local_e48._16_16_ = (undefined1  [16])0x0;
  local_e28 = (undefined1  [16])0x0;
  local_e18 = (undefined1  [16])0x0;
  local_e08 = (undefined1  [16])0x0;
  local_df8 = (undefined1  [16])0x0;
  local_de8 = SUB1613((undefined1  [16])0x0,0);
  uStack_ddb = 0;
  uStack_dd8 = 0;
  abStack_dd4[0] = false;
  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
            ((cpp_dec_float<200u,int,void> *)local_e48,0.0);
  if (bVar21) {
    puVar8 = (uint *)local_738;
    pcVar16 = &local_cb8;
    for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
      (pcVar16->data)._M_elems[0] = *puVar8;
      puVar8 = puVar8 + (ulong)bVar22 * -2 + 1;
      pcVar16 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar16 + ((ulong)bVar22 * -2 + 1) * 4);
    }
    local_cb8.exp = local_6c8;
    local_cb8.neg = local_6c4;
    local_cb8.fpclass = local_6c0;
    local_cb8.prec_elem = iStack_6bc;
    puVar8 = (uint *)local_ab8;
    pcVar16 = &local_c38;
    for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
      (pcVar16->data)._M_elems[0] = *puVar8;
      puVar8 = puVar8 + (ulong)bVar22 * -2 + 1;
      pcVar16 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar16 + ((ulong)bVar22 * -2 + 1) * 4);
    }
    local_c38.exp = local_a48;
    local_c38.neg = local_a44;
    local_c38.fpclass = local_a40;
    local_c38.prec_elem = iStack_a3c;
    if (0 < this->m_maxIterations) {
      local_f70 = (Item *)&lp->
                           super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ;
      local_ed8 = (uint *)local_e48;
      if ((char)local_fb4 != '\0') {
        local_ed8 = (uint *)local_ec8;
      }
      local_ee0 = (uint *)local_ec8;
      if ((char)local_fb4 != '\0') {
        local_ee0 = (uint *)local_e48;
      }
      local_f78 = &(this->m_minImprovement).m_backend;
      iVar6 = 0;
      local_dc8._0_4_ = (int)(local_fb4 << 0x1f) >> 0x1f;
      local_dc8._4_4_ = (int)(local_fb4 << 0x1f) >> 0x1f;
      local_dc8._8_4_ = (int)(local_fb4 << 0x1f) >> 0x1f;
      local_dc8._12_4_ = 0;
      local_ed0 = this;
      do {
        if ((char)local_fb4 == '\0') {
          pcVar14 = local_d38;
          pvVar19 = local_8b8;
          for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
            *(undefined4 *)
             &(pvVar19->
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              )._M_impl.super__Vector_impl_data._M_start = *(undefined4 *)pcVar14;
            pcVar14 = pcVar14 + ((ulong)bVar22 * -2 + 1) * 4;
            pvVar19 = (vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       *)((long)pvVar19 + (ulong)bVar22 * -8 + 4);
          }
          local_848 = iStack_cc8;
          local_844 = uStack_cc4;
          local_840 = (fpclass_type)local_cc0;
          iStack_83c = local_cc0._4_4_;
          computeScalingVec<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)local_f68,(soplex *)lp,
                     (SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *)local_f90,
                     (vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      *)local_fa8,local_8b8,pnVar18);
          pcVar16 = (cpp_dec_float<200U,_int,_void> *)local_f68;
          puVar8 = (uint *)local_ec8;
          for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
            *puVar8 = (pcVar16->data)._M_elems[0];
            pcVar16 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar16 + (ulong)bVar22 * -8 + 4);
            puVar8 = puVar8 + (ulong)bVar22 * -2 + 1;
          }
          uStack_e58 = uStack_ef8;
          abStack_e54[0] = bStack_ef4;
          local_e50 = local_ef0;
          pcVar14 = local_d38;
          pvVar19 = local_938;
          for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
            *(undefined4 *)
             &(pvVar19->
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              )._M_impl.super__Vector_impl_data._M_start = *(undefined4 *)pcVar14;
            pcVar14 = pcVar14 + ((ulong)bVar22 * -2 + 1) * 4;
            pvVar19 = (vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       *)((long)pvVar19 + (ulong)bVar22 * -8 + 4);
          }
          local_8c8 = iStack_cc8;
          local_8c4 = uStack_cc4;
          local_8c0 = (fpclass_type)local_cc0;
          iStack_8bc = local_cc0._4_4_;
          computeScalingVec<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)local_f68,(soplex *)local_f70,
                     (SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *)local_fa8,
                     (vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      *)local_f90,local_938,pnVar18);
          pcVar16 = (cpp_dec_float<200U,_int,_void> *)local_f68;
          puVar8 = (uint *)local_e48;
          for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
            *puVar8 = (pcVar16->data)._M_elems[0];
            pcVar16 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar16 + (ulong)bVar22 * -8 + 4);
            puVar8 = puVar8 + (ulong)bVar22 * -2 + 1;
          }
        }
        else {
          pcVar14 = local_d38;
          pvVar19 = local_7b8;
          for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
            *(undefined4 *)
             &(pvVar19->
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              )._M_impl.super__Vector_impl_data._M_start = *(undefined4 *)pcVar14;
            pcVar14 = pcVar14 + ((ulong)bVar22 * -2 + 1) * 4;
            pvVar19 = (vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       *)((long)pvVar19 + (ulong)bVar22 * -8 + 4);
          }
          local_748 = iStack_cc8;
          local_744 = uStack_cc4;
          local_740 = (fpclass_type)local_cc0;
          iStack_73c = local_cc0._4_4_;
          computeScalingVec<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)local_f68,(soplex *)local_f70,
                     (SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *)local_fa8,
                     (vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      *)local_f90,local_7b8,pnVar18);
          pcVar16 = (cpp_dec_float<200U,_int,_void> *)local_f68;
          puVar8 = (uint *)local_ec8;
          for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
            *puVar8 = (pcVar16->data)._M_elems[0];
            pcVar16 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar16 + (ulong)bVar22 * -8 + 4);
            puVar8 = puVar8 + (ulong)bVar22 * -2 + 1;
          }
          uStack_e58 = uStack_ef8;
          abStack_e54[0] = bStack_ef4;
          local_e50 = local_ef0;
          pcVar14 = local_d38;
          pvVar19 = local_838;
          for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
            *(undefined4 *)
             &(pvVar19->
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              )._M_impl.super__Vector_impl_data._M_start = *(undefined4 *)pcVar14;
            pcVar14 = pcVar14 + ((ulong)bVar22 * -2 + 1) * 4;
            pvVar19 = (vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       *)((long)pvVar19 + (ulong)bVar22 * -8 + 4);
          }
          local_7c8 = iStack_cc8;
          local_7c4 = uStack_cc4;
          local_7c0 = (fpclass_type)local_cc0;
          iStack_7bc = local_cc0._4_4_;
          computeScalingVec<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)local_f68,(soplex *)lp,
                     (SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *)local_f90,
                     (vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      *)local_fa8,local_838,pnVar18);
          pcVar16 = (cpp_dec_float<200U,_int,_void> *)local_f68;
          puVar8 = (uint *)local_e48;
          for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
            *puVar8 = (pcVar16->data)._M_elems[0];
            pcVar16 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar16 + (ulong)bVar22 * -8 + 4);
            puVar8 = puVar8 + (ulong)bVar22 * -2 + 1;
          }
        }
        this = local_ed0;
        pcVar16 = local_f78;
        pSVar20 = (local_ed0->
                  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).spxout;
        uStack_dd8 = uStack_ef8;
        abStack_dd4[0] = bStack_ef4;
        local_dd0 = local_ef0;
        if ((pSVar20 != (SPxOut *)0x0) && (4 < (int)pSVar20->m_verbosity)) {
          local_f68._0_4_ = pSVar20->m_verbosity;
          local_db8._0_4_ = 5;
          (*pSVar20->_vptr_SPxOut[2])(pSVar20,local_db8);
          pSVar20 = (this->
                    super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).spxout;
          std::__ostream_insert<char,std::char_traits<char>>
                    (pSVar20->m_streams[pSVar20->m_verbosity],"Geometric scaling round ",0x18);
          std::ostream::operator<<((ostream *)pSVar20->m_streams[pSVar20->m_verbosity],iVar6);
          std::__ostream_insert<char,std::char_traits<char>>
                    (pSVar20->m_streams[pSVar20->m_verbosity]," col-ratio= ",0xc);
          puVar8 = local_ed8;
          pnVar17 = &local_9b8;
          for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
            (pnVar17->m_backend).data._M_elems[0] = *puVar8;
            puVar8 = puVar8 + (ulong)bVar22 * -2 + 1;
            pnVar17 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar17 + ((ulong)bVar22 * -2 + 1) * 4);
          }
          puVar8 = &uStack_dd8;
          if ((char)local_fb4 != '\0') {
            puVar8 = &uStack_e58;
          }
          local_9b8.m_backend.exp = *puVar8;
          pbVar9 = abStack_dd4;
          if ((char)local_fb4 != '\0') {
            pbVar9 = abStack_e54;
          }
          local_9b8.m_backend.neg = *pbVar9;
          local_9b8.m_backend._120_8_ = local_e50 & local_dc8._0_8_ | ~local_dc8._0_8_ & local_dd0;
          boost::multiprecision::operator<<(pSVar20->m_streams[pSVar20->m_verbosity],&local_9b8);
          std::__ostream_insert<char,std::char_traits<char>>
                    (pSVar20->m_streams[pSVar20->m_verbosity]," row-ratio= ",0xc);
          puVar8 = local_ee0;
          pnVar17 = &local_a38;
          for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
            (pnVar17->m_backend).data._M_elems[0] = *puVar8;
            puVar8 = puVar8 + (ulong)bVar22 * -2 + 1;
            pnVar17 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar17 + ((ulong)bVar22 * -2 + 1) * 4);
          }
          puVar8 = &uStack_e58;
          if ((char)local_fb4 != '\0') {
            puVar8 = &uStack_dd8;
          }
          local_a38.m_backend.exp = *puVar8;
          pbVar9 = abStack_e54;
          if ((char)local_fb4 != '\0') {
            pbVar9 = abStack_dd4;
          }
          local_a38.m_backend.neg = *pbVar9;
          local_a38.m_backend._120_8_ = local_dd0 & local_dc8._0_8_ | ~local_dc8._0_8_ & local_e50;
          boost::multiprecision::operator<<(pSVar20->m_streams[pSVar20->m_verbosity],&local_a38);
          cVar5 = (char)pSVar20->m_streams[pSVar20->m_verbosity];
          std::ios::widen((char)*(undefined8 *)
                                 (*(long *)pSVar20->m_streams[pSVar20->m_verbosity] + -0x18) + cVar5
                         );
          std::ostream::put(cVar5);
          std::ostream::flush();
          pSVar20 = (this->
                    super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).spxout;
          (*pSVar20->_vptr_SPxOut[2])(pSVar20,(cpp_dec_float<200U,_int,_void> *)local_f68);
        }
        local_ef0 = 0x1c00000000;
        local_f68._0_16_ = (undefined1  [16])0x0;
        local_f68._16_16_ = (undefined1  [16])0x0;
        local_f48 = (undefined1  [16])0x0;
        local_f38 = (undefined1  [16])0x0;
        local_f28 = (undefined1  [16])0x0;
        local_f18 = (undefined1  [16])0x0;
        local_f08 = SUB1613((undefined1  [16])0x0,0);
        uStack_efb = 0;
        uStack_ef8 = 0;
        bStack_ef4 = false;
        if ((cpp_dec_float<200U,_int,_void> *)local_f68 != pcVar16) {
          pcVar15 = pcVar16;
          pcVar13 = (cpp_dec_float<200U,_int,_void> *)local_f68;
          for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
            (pcVar13->data)._M_elems[0] = (pcVar15->data)._M_elems[0];
            pcVar15 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar15 + (ulong)bVar22 * -8 + 4);
            pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + (ulong)bVar22 * -8 + 4);
          }
          uStack_ef8 = (this->m_minImprovement).m_backend.exp;
          bStack_ef4 = (this->m_minImprovement).m_backend.neg;
          local_ef0._0_4_ = (this->m_minImprovement).m_backend.fpclass;
          local_ef0._4_4_ = (this->m_minImprovement).m_backend.prec_elem;
        }
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                  ((cpp_dec_float<200U,_int,_void> *)local_f68,&local_cb8);
        if ((((fpclass_type)local_e50 != cpp_dec_float_NaN) &&
            ((fpclass_type)local_ef0 != cpp_dec_float_NaN)) &&
           (iVar7 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                              ((cpp_dec_float<200U,_int,_void> *)local_ec8,
                               (cpp_dec_float<200U,_int,_void> *)local_f68), 0 < iVar7)) {
          local_d40._0_4_ = cpp_dec_float_finite;
          local_d40._4_4_ = 0x1c;
          local_db8._0_16_ = (undefined1  [16])0x0;
          local_db8._16_16_ = (undefined1  [16])0x0;
          local_d98 = (undefined1  [16])0x0;
          local_d88 = (undefined1  [16])0x0;
          local_d78 = (undefined1  [16])0x0;
          local_d68 = (undefined1  [16])0x0;
          local_d58 = SUB1613((undefined1  [16])0x0,0);
          uStack_d4b = 0;
          iStack_d48 = 0;
          bStack_d44 = false;
          if ((cpp_dec_float<200U,_int,_void> *)local_db8 != pcVar16) {
            pcVar15 = (cpp_dec_float<200U,_int,_void> *)local_db8;
            for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
              (pcVar15->data)._M_elems[0] = (pcVar16->data)._M_elems[0];
              pcVar16 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar16 + (ulong)bVar22 * -8 + 4);
              pcVar15 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar15 + (ulong)bVar22 * -8 + 4);
            }
            iStack_d48 = (this->m_minImprovement).m_backend.exp;
            bStack_d44 = (this->m_minImprovement).m_backend.neg;
            local_d40._0_4_ = (this->m_minImprovement).m_backend.fpclass;
            local_d40._4_4_ = (this->m_minImprovement).m_backend.prec_elem;
          }
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                    ((cpp_dec_float<200U,_int,_void> *)local_db8,&local_c38);
          if ((((fpclass_type)local_dd0 != cpp_dec_float_NaN) &&
              ((fpclass_type)local_d40 != cpp_dec_float_NaN)) &&
             (iVar7 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                ((cpp_dec_float<200U,_int,_void> *)local_e48,
                                 (cpp_dec_float<200U,_int,_void> *)local_db8), 0 < iVar7)) break;
        }
        puVar8 = (uint *)local_ec8;
        pcVar16 = &local_cb8;
        for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
          (pcVar16->data)._M_elems[0] = *puVar8;
          puVar8 = puVar8 + (ulong)bVar22 * -2 + 1;
          pcVar16 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar16 + ((ulong)bVar22 * -2 + 1) * 4)
          ;
        }
        local_cb8.exp = uStack_e58;
        local_cb8.neg = abStack_e54[0];
        local_cb8.fpclass = (fpclass_type)local_e50;
        local_cb8.prec_elem = local_e50._4_4_;
        puVar8 = (uint *)local_e48;
        pcVar16 = &local_c38;
        for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
          (pcVar16->data)._M_elems[0] = *puVar8;
          puVar8 = puVar8 + (ulong)bVar22 * -2 + 1;
          pcVar16 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar16 + ((ulong)bVar22 * -2 + 1) * 4)
          ;
        }
        local_c38.exp = uStack_dd8;
        local_c38.neg = abStack_dd4[0];
        local_c38.fpclass = (fpclass_type)local_dd0;
        local_c38.prec_elem = local_dd0._4_4_;
        iVar6 = iVar6 + 1;
      } while (iVar6 < this->m_maxIterations);
    }
    pnVar18 = &this->m_minImprovement;
    local_ef0 = 0x1c00000000;
    local_f68._0_16_ = (undefined1  [16])0x0;
    local_f68._16_16_ = (undefined1  [16])0x0;
    local_f48 = (undefined1  [16])0x0;
    local_f38 = (undefined1  [16])0x0;
    local_f28 = (undefined1  [16])0x0;
    local_f18 = (undefined1  [16])0x0;
    local_f08 = SUB1613((undefined1  [16])0x0,0);
    uStack_efb = 0;
    uStack_ef8 = 0;
    bStack_ef4 = false;
    if ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
         *)local_f68 != pnVar18) {
      pnVar17 = pnVar18;
      puVar8 = (uint *)local_f68;
      for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
        *puVar8 = (pnVar17->m_backend).data._M_elems[0];
        pnVar17 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar17 + (ulong)bVar22 * -8 + 4);
        puVar8 = puVar8 + (ulong)bVar22 * -2 + 1;
      }
      uStack_ef8 = (this->m_minImprovement).m_backend.exp;
      bStack_ef4 = (this->m_minImprovement).m_backend.neg;
      local_ef0._0_4_ = (this->m_minImprovement).m_backend.fpclass;
      local_ef0._4_4_ = (this->m_minImprovement).m_backend.prec_elem;
    }
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
              ((cpp_dec_float<200U,_int,_void> *)local_f68,
               (cpp_dec_float<200U,_int,_void> *)local_738);
    if ((((fpclass_type)local_e50 == cpp_dec_float_NaN) ||
        ((fpclass_type)local_ef0 == cpp_dec_float_NaN)) ||
       (iVar6 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                          ((cpp_dec_float<200U,_int,_void> *)local_ec8,
                           (cpp_dec_float<200U,_int,_void> *)local_f68), 0 < iVar6)) {
      local_d40._0_4_ = cpp_dec_float_finite;
      local_d40._4_4_ = 0x1c;
      local_db8._0_16_ = (undefined1  [16])0x0;
      local_db8._16_16_ = (undefined1  [16])0x0;
      local_d98 = (undefined1  [16])0x0;
      local_d88 = (undefined1  [16])0x0;
      local_d78 = (undefined1  [16])0x0;
      local_d68 = (undefined1  [16])0x0;
      local_d58 = SUB1613((undefined1  [16])0x0,0);
      uStack_d4b = 0;
      iStack_d48 = 0;
      bStack_d44 = false;
      if ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *)local_db8 != pnVar18) {
        puVar8 = (uint *)local_db8;
        for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
          *puVar8 = (pnVar18->m_backend).data._M_elems[0];
          pnVar18 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar18 + (ulong)bVar22 * -8 + 4);
          puVar8 = puVar8 + (ulong)bVar22 * -2 + 1;
        }
        iStack_d48 = (this->m_minImprovement).m_backend.exp;
        bStack_d44 = (this->m_minImprovement).m_backend.neg;
        local_d40._0_4_ = (this->m_minImprovement).m_backend.fpclass;
        local_d40._4_4_ = (this->m_minImprovement).m_backend.prec_elem;
      }
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                ((cpp_dec_float<200U,_int,_void> *)local_db8,
                 (cpp_dec_float<200U,_int,_void> *)local_ab8);
      if ((((fpclass_type)local_dd0 == cpp_dec_float_NaN) ||
          ((fpclass_type)local_d40 == cpp_dec_float_NaN)) ||
         (iVar6 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                            ((cpp_dec_float<200U,_int,_void> *)local_e48,
                             (cpp_dec_float<200U,_int,_void> *)local_db8), 0 < iVar6))
      goto LAB_0058de16;
      vecExp_00 = (this->
                  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).m_activeColscaleExp;
      vecExp = (this->
               super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).m_activeRowscaleExp;
      if ((this->postequilibration & 1U) == 0) goto LAB_0058dfa3;
      goto LAB_0058df43;
    }
    vecExp_00 = (this->
                super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).m_activeColscaleExp;
    vecExp = (this->
             super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).m_activeRowscaleExp;
    if (this->postequilibration != false) goto LAB_0058df43;
LAB_0058dfa3:
    SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::computeExpVec(&this->
                     super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ,(vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      *)local_f90,vecExp_00);
    SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::computeExpVec(&this->
                     super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ,(vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      *)local_fa8,vecExp);
  }
  else {
LAB_0058de16:
    bVar21 = this->postequilibration == false;
    if (bVar21) {
      pSVar20 = (this->
                super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).spxout;
      if ((pSVar20 != (SPxOut *)0x0) && (3 < (int)pSVar20->m_verbosity)) {
        local_c38.data._M_elems[0] = 4;
        local_cb8.data._M_elems[0] = pSVar20->m_verbosity;
        (*pSVar20->_vptr_SPxOut[2])();
        pSVar20 = (this->
                  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).spxout;
        std::__ostream_insert<char,std::char_traits<char>>
                  (pSVar20->m_streams[pSVar20->m_verbosity],"No geometric scaling done.",0x1a);
        cVar5 = (char)pSVar20->m_streams[pSVar20->m_verbosity];
        std::ios::widen((char)*(undefined8 *)
                               (*(long *)pSVar20->m_streams[pSVar20->m_verbosity] + -0x18) + cVar5);
        std::ostream::put(cVar5);
        std::ostream::flush();
        pSVar20 = (this->
                  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).spxout;
        (*pSVar20->_vptr_SPxOut[2])(pSVar20,&local_cb8);
      }
      lp->_isScaled = true;
      goto LAB_0058e36f;
    }
    vecExp_00 = (this->
                super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).m_activeColscaleExp;
    vecExp = (this->
             super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).m_activeRowscaleExp;
    pcVar14 = (cpp_dec_float<200u,int,void> *)local_fa8._0_8_;
    if (bVar21) goto LAB_0058dfa3;
    for (; this_02 = (Item *)local_f90._0_8_,
        pcVar14 != (cpp_dec_float<200u,int,void> *)local_fa8._8_8_; pcVar14 = pcVar14 + 0x80) {
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=(pcVar14,1.0);
    }
    for (; this_02 != (Item *)local_f90._8_8_;
        this_02 = (Item *)&this_02[3].data.
                           super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           .memsize) {
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                ((cpp_dec_float<200u,int,void> *)this_02,1.0);
    }
LAB_0058df43:
    pcVar14 = local_d38;
    pnVar18 = &local_2b0;
    for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
      (pnVar18->m_backend).data._M_elems[0] = *(uint *)pcVar14;
      pcVar14 = pcVar14 + ((ulong)bVar22 * -2 + 1) * 4;
      pnVar18 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar18 + ((ulong)bVar22 * -2 + 1) * 4);
    }
    local_2b0.m_backend.exp = iStack_cc8;
    local_2b0.m_backend.neg = (bool)uStack_cc4;
    local_2b0.m_backend.fpclass = (fpclass_type)local_cc0;
    local_2b0.m_backend.prec_elem = local_cc0._4_4_;
    SPxEquiliSC<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::computePostequiExpVecs
              (lp,(vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   *)local_fa8,
               (vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                *)local_f90,vecExp,vecExp_00,&local_2b0);
  }
  (*(this->
    super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    )._vptr_SPxScaler[2])(this,lp);
  pSVar20 = (this->
            super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).spxout;
  if (pSVar20 != (SPxOut *)0x0) {
    if (4 < (int)pSVar20->m_verbosity) {
      local_c38.data._M_elems[0] = 5;
      local_cb8.data._M_elems[0] = pSVar20->m_verbosity;
      (*pSVar20->_vptr_SPxOut[2])();
      pSVar20 = (this->
                super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).spxout;
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar20->m_streams[pSVar20->m_verbosity],"Row scaling min= ",0x11);
      (*(this->
        super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        )._vptr_SPxScaler[0x31])(&local_330,this);
      boost::multiprecision::operator<<(pSVar20->m_streams[pSVar20->m_verbosity],&local_330);
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar20->m_streams[pSVar20->m_verbosity]," max= ",6);
      (*(this->
        super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        )._vptr_SPxScaler[0x32])(&local_3b0,this);
      boost::multiprecision::operator<<(pSVar20->m_streams[pSVar20->m_verbosity],&local_3b0);
      cVar5 = (char)pSVar20->m_streams[pSVar20->m_verbosity];
      std::ios::widen((char)*(undefined8 *)
                             (*(long *)pSVar20->m_streams[pSVar20->m_verbosity] + -0x18) + cVar5);
      std::ostream::put(cVar5);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar20->m_streams[pSVar20->m_verbosity],"IGEOSC06 Col scaling min= ",0x1a);
      (*(this->
        super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        )._vptr_SPxScaler[0x2f])(&local_430,this);
      boost::multiprecision::operator<<(pSVar20->m_streams[pSVar20->m_verbosity],&local_430);
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar20->m_streams[pSVar20->m_verbosity]," max= ",6);
      (*(this->
        super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        )._vptr_SPxScaler[0x30])(&local_4b0,this);
      boost::multiprecision::operator<<(pSVar20->m_streams[pSVar20->m_verbosity],&local_4b0);
      cVar5 = (char)pSVar20->m_streams[pSVar20->m_verbosity];
      std::ios::widen((char)*(undefined8 *)
                             (*(long *)pSVar20->m_streams[pSVar20->m_verbosity] + -0x18) + cVar5);
      std::ostream::put(cVar5);
      std::ostream::flush();
      pSVar20 = (this->
                super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).spxout;
      (*pSVar20->_vptr_SPxOut[2])(pSVar20,&local_cb8);
      pSVar20 = (this->
                super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).spxout;
      if (pSVar20 == (SPxOut *)0x0) goto LAB_0058e36f;
    }
    if (3 < (int)pSVar20->m_verbosity) {
      local_c38.data._M_elems[0] = 4;
      local_cb8.data._M_elems[0] = pSVar20->m_verbosity;
      (*pSVar20->_vptr_SPxOut[2])();
      pSVar20 = (this->
                super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).spxout;
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar20->m_streams[pSVar20->m_verbosity],"after scaling: ",0xf);
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar20->m_streams[pSVar20->m_verbosity]," min= ",6);
      (*(lp->
        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._vptr_ClassArray[3])(&local_530,lp,0);
      boost::multiprecision::operator<<(pSVar20->m_streams[pSVar20->m_verbosity],&local_530);
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar20->m_streams[pSVar20->m_verbosity]," max= ",6);
      (*(lp->
        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._vptr_ClassArray[4])(&local_5b0,lp,0);
      boost::multiprecision::operator<<(pSVar20->m_streams[pSVar20->m_verbosity],&local_5b0);
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar20->m_streams[pSVar20->m_verbosity]," col-ratio= ",0xc);
      (*(this->
        super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        )._vptr_SPxScaler[0x33])(&local_630,this,lp);
      boost::multiprecision::operator<<(pSVar20->m_streams[pSVar20->m_verbosity],&local_630);
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar20->m_streams[pSVar20->m_verbosity]," row-ratio= ",0xc);
      (*(this->
        super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        )._vptr_SPxScaler[0x34])(&local_6b0,this,lp);
      boost::multiprecision::operator<<(pSVar20->m_streams[pSVar20->m_verbosity],&local_6b0);
      cVar5 = (char)pSVar20->m_streams[pSVar20->m_verbosity];
      std::ios::widen((char)*(undefined8 *)
                             (*(long *)pSVar20->m_streams[pSVar20->m_verbosity] + -0x18) + cVar5);
      std::ostream::put(cVar5);
      std::ostream::flush();
      pSVar20 = (this->
                super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).spxout;
      (*pSVar20->_vptr_SPxOut[2])(pSVar20,&local_cb8);
    }
  }
LAB_0058e36f:
  if ((Item *)local_f90._0_8_ != (Item *)0x0) {
    operator_delete((void *)local_f90._0_8_,(long)local_f80 - local_f90._0_8_);
  }
  if ((cpp_dec_float<200u,int,void> *)local_fa8._0_8_ != (cpp_dec_float<200u,int,void> *)0x0) {
    operator_delete((void *)local_fa8._0_8_,(long)local_f98 - local_fa8._0_8_);
  }
  return;
}

Assistant:

void SPxGeometSC<R>::scale(SPxLPBase<R>& lp, bool persistent)
{

   SPX_MSG_INFO1((*this->spxout), (*this->spxout) << "Geometric scaling LP" <<
                 (persistent ? " (persistent)" : "") << (postequilibration ? " with post-equilibration" : "") <<
                 std::endl;)

   this->setup(lp);

   /* We want to do that direction first, with the lower ratio.
    * See SPxEquiliSC<R>::scale() for a reasoning.
    */
   const R colratio = this->maxColRatio(lp);
   const R rowratio = this->maxRowRatio(lp);
   R epsilon = this->tolerances()->epsilon();

   const bool colFirst = colratio < rowratio;

   R p0start;
   R p1start;

   if(colFirst)
   {
      p0start = colratio;
      p1start = rowratio;
   }
   else
   {
      p0start = rowratio;
      p1start = colratio;
   }

   SPX_MSG_INFO2((*this->spxout), (*this->spxout) << "before scaling:"
                 << " min= " << lp.minAbsNzo()
                 << " max= " << lp.maxAbsNzo()
                 << " col-ratio= " << colratio
                 << " row-ratio= " << rowratio
                 << std::endl;)

   // perform geometric scaling only if maximum ratio is above threshold
   bool geoscale = p1start > m_goodEnoughRatio;

   if(!geoscale)
   {
      SPX_MSG_INFO2((*this->spxout), (*this->spxout) << "No geometric scaling done, ratio good enough" <<
                    std::endl;)

      if(!postequilibration)
      {
         lp.setScalingInfo(true);
         return;
      }

      SPX_MSG_INFO2((*this->spxout),
                    (*this->spxout) << " ... but will still perform equilibrium scaling" <<
                    std::endl;)
   }

   std::vector<R> rowscale(unsigned(lp.nRows()), 1.0);
   std::vector<R> colscale(unsigned(lp.nCols()), 1.0);

   R p0 = 0.0;
   R p1 = 0.0;

   if(geoscale)
   {
      R p0prev = p0start;
      R p1prev = p1start;

      // we make at most maxIterations.
      for(int count = 0; count < m_maxIterations; count++)
      {
         if(colFirst)
         {
            p0 = computeScalingVec(lp.colSet(), rowscale, colscale, epsilon);
            p1 = computeScalingVec(lp.rowSet(), colscale, rowscale, epsilon);
         }
         else
         {
            p0 = computeScalingVec(lp.rowSet(), colscale, rowscale, epsilon);
            p1 = computeScalingVec(lp.colSet(), rowscale, colscale, epsilon);
         }

         SPX_MSG_INFO3((*this->spxout), (*this->spxout) << "Geometric scaling round " << count
                       << " col-ratio= " << (colFirst ? p0 : p1)
                       << " row-ratio= " << (colFirst ? p1 : p0)
                       << std::endl;)

         if(p0 > m_minImprovement * p0prev && p1 > m_minImprovement * p1prev)
            break;

         p0prev = p0;
         p1prev = p1;
      }

      // perform geometric scaling only if there is enough (default 15%) improvement.
      geoscale = (p0 <= m_minImprovement * p0start || p1 <= m_minImprovement * p1start);
   }

   if(!geoscale && !postequilibration)
   {
      SPX_MSG_INFO2((*this->spxout), (*this->spxout) << "No geometric scaling done." << std::endl;)
      lp.setScalingInfo(true);
   }
   else
   {
      DataArray<int>& colscaleExp = *this->m_activeColscaleExp;
      DataArray<int>& rowscaleExp = *this->m_activeRowscaleExp;

      if(postequilibration)
      {
         if(!geoscale)
         {
            std::fill(rowscale.begin(), rowscale.end(), 1.0);
            std::fill(colscale.begin(), colscale.end(), 1.0);
         }

         SPxEquiliSC<R>::computePostequiExpVecs(lp, rowscale, colscale, rowscaleExp, colscaleExp, epsilon);
      }
      else
      {
         this->computeExpVec(colscale, colscaleExp);
         this->computeExpVec(rowscale, rowscaleExp);
      }

      this->applyScaling(lp);

      SPX_MSG_INFO3((*this->spxout), (*this->spxout) << "Row scaling min= " << this->minAbsRowscale()
                    << " max= " << this->maxAbsRowscale()
                    << std::endl
                    << "IGEOSC06 Col scaling min= " << this->minAbsColscale()
                    << " max= " << this->maxAbsColscale()
                    << std::endl;)

      SPX_MSG_INFO2((*this->spxout), (*this->spxout) << "after scaling: "
                    << " min= " << lp.minAbsNzo(false)
                    << " max= " << lp.maxAbsNzo(false)
                    << " col-ratio= " << this->maxColRatio(lp)
                    << " row-ratio= " << this->maxRowRatio(lp)
                    << std::endl;)
   }
}